

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshSimplify.cpp
# Opt level: O0

void __thiscall MeshSimplify::output(MeshSimplify *this)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  long in_RDI;
  iterator it2;
  iterator it1;
  Vertex *v_1;
  int i_1;
  Vertex *v;
  int i;
  int cntf;
  int cntv;
  int cnt;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  _Rb_tree_const_iterator<int> *in_stack_ffffffffffffff78;
  _Self local_50;
  _Self local_48;
  _Self local_40;
  _Self local_38;
  uint *local_30;
  int local_24;
  int *local_20;
  int local_18;
  int local_14;
  undefined4 local_10;
  int local_c;
  
  local_c = 0;
  local_10 = 0;
  local_14 = 0;
  for (local_18 = 1; local_18 <= *(int *)(*(long *)(in_RDI + 0x18) + 80000000);
      local_18 = local_18 + 1) {
    if ((*(byte *)(*(long *)(*(long *)(in_RDI + 0x18) + 0x4c4b408) + (long)local_18) & 1) == 0) {
      local_20 = (int *)(*(long *)(in_RDI + 0x18) + (long)local_18 * 0x50);
      local_c = local_c + 1;
      *local_20 = local_c;
      printf("v %lf %lf %lf\n",*(undefined8 *)(local_20 + 2),*(undefined8 *)(local_20 + 4),
             *(undefined8 *)(local_20 + 6));
    }
  }
  for (local_24 = 1; local_24 <= *(int *)(*(long *)(in_RDI + 0x18) + 80000000);
      local_24 = local_24 + 1) {
    if ((*(byte *)(*(long *)(*(long *)(in_RDI + 0x18) + 0x4c4b408) + (long)local_24) & 1) == 0) {
      local_30 = (uint *)(*(long *)(in_RDI + 0x18) + (long)local_24 * 0x50);
      local_38._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
      while( true ) {
        local_40._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffff68);
        bVar2 = std::operator!=(&local_38,&local_40);
        iVar1 = local_24;
        if (!bVar2) break;
        piVar3 = std::_Rb_tree_const_iterator<int>::operator*
                           ((_Rb_tree_const_iterator<int> *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        if (iVar1 < *piVar3) {
          local_48._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68)
          ;
          while( true ) {
            local_50._M_node =
                 (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffff68)
            ;
            bVar2 = std::operator!=(&local_48,&local_50);
            if (!bVar2) break;
            piVar3 = std::_Rb_tree_const_iterator<int>::operator*
                               ((_Rb_tree_const_iterator<int> *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
            iVar1 = *piVar3;
            piVar3 = std::_Rb_tree_const_iterator<int>::operator*
                               ((_Rb_tree_const_iterator<int> *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
            if (iVar1 < *piVar3) {
              std::_Rb_tree_const_iterator<int>::operator*
                        ((_Rb_tree_const_iterator<int> *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
              std::_Rb_tree_const_iterator<int>::operator*
                        ((_Rb_tree_const_iterator<int> *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
              bVar2 = Vertex::hasNeighborVertex
                                ((Vertex *)
                                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                 (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
              if (bVar2) {
                in_stack_ffffffffffffff70 = *local_30;
                in_stack_ffffffffffffff68 =
                     *(set<int,_std::less<int>,_std::allocator<int>_> **)(in_RDI + 0x18);
                piVar3 = std::_Rb_tree_const_iterator<int>::operator*
                                   ((_Rb_tree_const_iterator<int> *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
                in_stack_ffffffffffffff74 =
                     *(uint *)((long)in_stack_ffffffffffffff68 + (long)*piVar3 * 0x50);
                in_stack_ffffffffffffff78 = *(_Rb_tree_const_iterator<int> **)(in_RDI + 0x18);
                piVar3 = std::_Rb_tree_const_iterator<int>::operator*
                                   ((_Rb_tree_const_iterator<int> *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
                printf("f %d %d %d\n",(ulong)in_stack_ffffffffffffff70,
                       (ulong)in_stack_ffffffffffffff74,
                       (ulong)*(uint *)&in_stack_ffffffffffffff78[(long)*piVar3 * 10]._M_node);
                local_14 = local_14 + 1;
              }
            }
            std::_Rb_tree_const_iterator<int>::operator++
                      (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
          }
        }
        std::_Rb_tree_const_iterator<int>::operator++
                  (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      }
    }
  }
  return;
}

Assistant:

void MeshSimplify::output(){
	int cnt = 0;
	int cntv=0,cntf=0;
	for(int i = 1;i <= vGroup->cntVertex;i++){
		if(vGroup->isDeleted[i])
			continue;
		Vertex* v = &vGroup->group[i];
		cnt++;
		v->id = cnt;
		printf("v %lf %lf %lf\n",v->pos.x,v->pos.y,v->pos.z);
	}	
	for(int i = 1;i <= vGroup->cntVertex;i++){
		if(vGroup->isDeleted[i])
			continue;
		Vertex* v = &(vGroup->group[i]);
		for(set<int>::iterator it1 = v->neighborVertexIds.begin();it1 != v->neighborVertexIds.end();it1++){
			if(i >= (*it1))
				continue;
			for(set<int>::iterator it2 = v->neighborVertexIds.begin();it2 != v->neighborVertexIds.end();it2++){
				if((*it1) < (*it2) && (vGroup->group[(*it1)].hasNeighborVertex(*it2))){
					printf("f %d %d %d\n",v->id,vGroup->group[(*it1)].id,vGroup->group[(*it2)].id);
					cntf++;
				}	
			}
		}

	}
}